

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkComputeLevelD(Acb_Ntk_t *p,Vec_Int_t *vTfo)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  if ((p->vLevelD).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vLevelD).nCap < (int)uVar1) {
      piVar5 = (p->vLevelD).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
      }
      (p->vLevelD).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vLevelD).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vLevelD).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vLevelD).nSize = uVar1;
  }
  lVar6 = (long)vTfo->nSize;
  if (0 < (long)vTfo->nSize) {
    do {
      if (vTfo->nSize < lVar6) goto LAB_00383f38;
      Acb_ObjComputeLevelD(p,vTfo->pArray[lVar6 + -1]);
      bVar3 = 1 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar3);
  }
  lVar6 = (long)(p->vCos).nSize;
  if (lVar6 < 1) {
    iVar4 = 0;
  }
  else {
    lVar7 = 0;
    iVar4 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar7];
      if ((long)iVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x113,"int Acb_ObjLevelD(Acb_Ntk_t *, int)");
      }
      if ((p->vLevelD).nSize <= iVar2) {
LAB_00383f38:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vLevelD).pArray[iVar2];
      if (iVar4 <= iVar2) {
        iVar4 = iVar2;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  p->LevelMax = iVar4;
  return iVar4;
}

Assistant:

int Acb_NtkComputeLevelD( Acb_Ntk_t * p, Vec_Int_t * vTfo )
{
    // it is assumed that vTfo contains CO nodes and level of new nodes was already updated
    int i, iObj, Level = 0;
    if ( !Acb_NtkHasObjLevelD( p ) )
        Acb_NtkCleanObjLevelD( p );
    Vec_IntForEachEntryReverse( vTfo, iObj, i )
        Acb_ObjComputeLevelD( p, iObj );
    Acb_NtkForEachCo( p, iObj, i )
        Level = Abc_MaxInt( Level, Acb_ObjLevelD(p, iObj) );
    p->LevelMax = Level;
    return Level;
}